

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

void wasm::Debug::dumpDWARF(Module *wasm)

{
  pointer pCVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  raw_ostream *prVar5;
  undefined8 in_RCX;
  CustomSection *section;
  pointer pCVar6;
  string_view s;
  undefined1 local_80 [8];
  BinaryenDWARFInfo info;
  
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_80,wasm);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DWARF debug info\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"================\n\n",0x12);
  pCVar6 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar1) {
    do {
      s._M_str = (char *)0x0;
      s._M_len = (size_t)(pCVar6->name)._M_dataplus._M_p;
      join_0x00000010_0x00000000_ =
           IString::interned((IString *)(pCVar6->name)._M_string_length,s,SUB81(in_RCX,0));
      bVar3 = IString::startsWith<8>((IString *)&info.context,(char (*) [8])".debug_");
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Contains section ",0x11);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pCVar6->name)._M_dataplus._M_p,
                            (pCVar6->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes)\n",8);
      }
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar1);
  }
  uVar2 = info.sections._24_8_;
  prVar5 = llvm::outs();
  (**(code **)(*(long *)uVar2 + 0x10))(uVar2,prVar5);
  if (info.sections._24_8_ != 0) {
    (**(code **)(*(long *)info.sections._24_8_ + 8))();
  }
  info.sections._24_8_ = 0;
  llvm::
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)local_80);
  return;
}

Assistant:

void dumpDWARF(const Module& wasm) {
  BinaryenDWARFInfo info(wasm);
  std::cout << "DWARF debug info\n";
  std::cout << "================\n\n";
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      std::cout << "Contains section " << section.name << " ("
                << section.data.size() << " bytes)\n";
    }
  }
  llvm::DIDumpOptions options;
  options.DumpType = llvm::DIDT_All;
  options.ShowChildren = true;
  options.Verbose = true;
  info.context->dump(llvm::outs(), options);
}